

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_arg * __thiscall
duckdb_fmt::v6::
basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
::arg(format_arg *__return_storage_ptr__,
     basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
     *this,basic_string_view<wchar_t> name)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  wchar_t *pwVar7;
  ulong uVar8;
  long lVar9;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pwVar7 = name.data_;
  internal::
  arg_map<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  ::init(&this->map_,(EVP_PKEY_CTX *)&this->args_);
  internal::
  arg_map<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  ::find(__return_storage_ptr__,&this->map_,name);
  if (__return_storage_ptr__->type_ != none_type) {
    return __return_storage_ptr__;
  }
  local_70[0] = local_60;
  lVar9 = name.size_ + (long)pwVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,pwVar7,lVar9);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1ddabf7);
  local_90 = &local_80;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_c0 = *puVar5;
    uStack_b8 = (undefined4)plVar2[3];
    uStack_b4 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar5;
    local_d0 = (ulong *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pwVar7,lVar9);
  uVar8 = 0xf;
  if (local_d0 != &local_c0) {
    uVar8 = local_c0;
  }
  if (uVar8 < (ulong)(local_a8 + local_c8)) {
    uVar8 = 0xf;
    if (local_b0 != local_a0) {
      uVar8 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_c8) <= uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_0181739a;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
LAB_0181739a:
  local_f0 = &local_e0;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_e0 = *puVar1;
    uStack_d8 = puVar3[3];
  }
  else {
    local_e0 = *puVar1;
    local_f0 = (undefined8 *)*puVar3;
  }
  local_e8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
  psVar6 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_50.field_2._M_allocated_capacity = *psVar6;
    local_50.field_2._8_8_ = plVar2[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar6;
    local_50._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_50._M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  on_error(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

typename basic_format_context<Range, Char>::format_arg
basic_format_context<Range, Char>::arg(basic_string_view<char_type> name) {
  map_.init(args_);
  format_arg arg = map_.find(name);
  if (arg.type() == internal::none_type) this->on_error("Argument with name \"" + name.to_string() + "\" not found, did you mean to use it as a format specifier (e.g. {:" + name.to_string() + "}");
  return arg;
}